

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O3

LispPTR LCFetchMethod(LispPTR class,LispPTR selector)

{
  LispPTR *pLVar1;
  DLword *pDVar2;
  long lVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = (ulong)class;
  if (atom_instance == 0) {
    LCinit();
  }
  uVar7 = (ulong)(((selector ^ class) & 0x3ff) << 4);
  pLVar1 = (LispPTR *)((long)&LCMethodCache->class + uVar7);
  if ((*(LispPTR *)((long)&LCMethodCache->class + uVar7) == class) && (pLVar1[1] == selector)) {
    LVar5 = pLVar1[2];
  }
  else {
    uVar6 = *(ushort *)((ulong)(class >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if ((*(uint *)((long)DTDspace + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff) ==
        atom_class) {
      if ((class & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      LVar5 = *(LispPTR *)(Lisp_world + uVar9 + 0x10);
      while( true ) {
        if ((uVar9 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
        }
        pDVar2 = Lisp_world;
        uVar6 = *(uint *)(Lisp_world + uVar9 + 0x16);
        if ((ulong)uVar6 != 0) {
          if ((uVar6 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
          }
          lVar3 = 0;
          while (lVar8 = lVar3, LVar4 = *(LispPTR *)((long)Lisp_world + lVar8 + (ulong)uVar6 * 2),
                LVar4 != 0) {
            lVar3 = lVar8 + 4;
            if (LVar4 == selector) {
              *pLVar1 = class;
              pLVar1[1] = selector;
              uVar6 = *(uint *)(pDVar2 + uVar9 + 0x18);
              if ((uVar6 & 1) != 0) {
                printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
              }
              LVar5 = *(LispPTR *)((long)Lisp_world + lVar8 + (ulong)uVar6 * 2);
              pLVar1[2] = LVar5;
              return LVar5;
            }
          }
        }
        LVar4 = car(LVar5);
        if (LVar4 == 0) break;
        uVar9 = (ulong)LVar4;
        LVar5 = cdr(LVar5);
      }
      LVar5 = 0;
    }
    else {
      lcfuncall(atom_FetchMethod_LCUFN,2,3);
      LVar5 = 0xfffffffe;
    }
  }
  return LVar5;
}

Assistant:

LispPTR LCFetchMethod(LispPTR class, LispPTR selector) {
  struct LCMethodCacheEntry *ce;

  LC_INIT;

  /* Check cache before doing type check */
  ce = &(LCMethodCache[METH_CACHE_INDEX(class, selector)]);
  if (ce->class == class && ce->selector == selector) return ce->method_fn;

  /* it wasn't there, go search class then supers */

  if (!LC_TYPEP(class, atom_class)) RETCALL(atom_FetchMethod_LCUFN, 2);
  {
    LispPTR cur_class = class;
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      struct LCClass *classptr;
      LispPTR *selectorptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR)
        goto next_class;
      else
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; return NIL */
  return NIL_PTR;
}